

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

Index __thiscall
MADPComponentDiscreteObservations::JointToRestrictedJointObservationIndex
          (MADPComponentDiscreteObservations *this,Index joI,Scope *agSc_e)

{
  pointer puVar1;
  pointer puVar2;
  Index IVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  long lVar5;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jo_vec_e;
  allocator_type local_31;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  pvVar4 = JointToIndividualObservationIndices(this,joI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_30,
             (long)(agSc_e->super_SDT).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(agSc_e->super_SDT).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_31);
  puVar1 = (agSc_e->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(agSc_e->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar5 != 0) {
    puVar2 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = puVar2[puVar1[uVar6]];
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) < (ulong)(lVar5 >> 2));
  }
  IVar3 = IndividualToJointObservationIndices(this,&local_30,agSc_e);
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar3;
}

Assistant:

Index MADPComponentDiscreteObservations::
JointToRestrictedJointObservationIndex(
        Index joI, const Scope& agSc_e ) const
{
    const vector<Index>& jo_vec = JointToIndividualObservationIndices(joI);
    vector<Index> jo_vec_e(agSc_e.size());
    IndexTools::RestrictIndividualIndicesToScope(jo_vec, agSc_e, jo_vec_e);
    Index jo_e = IndividualToJointObservationIndices(jo_vec_e, agSc_e);
    return(jo_e);

}